

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  int *piVar1;
  ushort *puVar2;
  uchar uVar3;
  uchar uVar4;
  short sVar5;
  uchar *puVar6;
  bool bVar7;
  int cy;
  ushort uVar8;
  ImGuiContext *pIVar9;
  uint uVar10;
  int num_vertices;
  int iVar11;
  int iVar12;
  ulong uVar13;
  stbtt_vertex *vertices;
  ushort *puVar14;
  stbtt_vertex *psVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  short sVar19;
  int was_off;
  ulong uVar20;
  int iVar21;
  long lVar22;
  byte bVar23;
  short sVar24;
  byte bVar25;
  int sx;
  int sy;
  ushort uVar26;
  stbtt_int32 cy_00;
  stbtt_int32 sVar27;
  ushort *puVar28;
  stbtt_int32 cx;
  stbtt_int32 sVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  stbtt_vertex *comp_verts;
  float local_64;
  ushort *local_60;
  ulong local_58;
  stbtt_vertex **local_50;
  float local_44;
  stbtt_fontinfo *local_40;
  ulong local_38;
  
  puVar6 = info->data;
  uVar10 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  pIVar9 = GImGui;
  if ((int)uVar10 < 0) {
LAB_00170182:
    iVar12 = 0;
  }
  else {
    uVar13 = (ulong)uVar10;
    uVar8 = CONCAT11(puVar6[uVar13],puVar6[uVar13 + 1]);
    local_50 = pvertices;
    if ((short)uVar8 < 1) {
      if (uVar8 == 0xffff) {
        uVar20 = 0;
        vertices = (stbtt_vertex *)0x0;
        puVar14 = (ushort *)(puVar6 + uVar13 + 10);
        local_40 = info;
        bVar23 = 1;
        do {
          bVar25 = bVar23;
          if (bVar25 == 0) break;
          comp_verts = (stbtt_vertex *)0x0;
          bVar23 = *(byte *)((long)puVar14 + 1);
          if ((bVar23 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                          ,0x586,
                          "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
          }
          if ((bVar23 & 1) == 0) {
            iVar18 = (int)(char)puVar14[2];
            iVar12 = (int)*(char *)((long)puVar14 + 5);
            lVar22 = 6;
          }
          else {
            iVar18 = (int)CONCAT11((char)puVar14[2],*(undefined1 *)((long)puVar14 + 5));
            iVar12 = (int)(short)(puVar14[3] << 8 | puVar14[3] >> 8);
            lVar22 = 8;
          }
          puVar28 = (ushort *)(lVar22 + (long)puVar14);
          if ((bVar23 & 8) == 0) {
            if ((bVar23 & 0x40) == 0) {
              fVar33 = 0.0;
              if ((char)bVar23 < '\0') {
                fVar32 = (float)(int)(short)(*puVar28 << 8 | *puVar28 >> 8) * 6.1035156e-05;
                puVar2 = puVar28 + 3;
                fVar35 = (float)(int)(short)(puVar28[1] << 8 | puVar28[1] >> 8) * 6.1035156e-05;
                fVar33 = (float)(int)(short)(puVar28[2] << 8 | puVar28[2] >> 8) * 6.1035156e-05;
                puVar28 = puVar28 + 4;
                fVar34 = (float)(int)(short)(*puVar2 << 8 | *puVar2 >> 8) * 6.1035156e-05;
              }
              else {
                fVar35 = 0.0;
                fVar32 = 1.0;
                fVar34 = 1.0;
              }
            }
            else {
              puVar2 = puVar28 + 1;
              fVar32 = (float)(int)(short)(*puVar28 << 8 | *puVar28 >> 8) * 6.1035156e-05;
              puVar28 = puVar28 + 2;
              fVar33 = 0.0;
              fVar35 = 0.0;
              fVar34 = (float)(int)(short)(*puVar2 << 8 | *puVar2 >> 8) * 6.1035156e-05;
            }
          }
          else {
            fVar32 = (float)(int)(short)(*puVar28 << 8 | *puVar28 >> 8) * 6.1035156e-05;
            puVar28 = puVar28 + 1;
            fVar33 = 0.0;
            fVar35 = 0.0;
            fVar34 = fVar32;
          }
          uVar8 = puVar14[1];
          fVar30 = fVar32 * fVar32 + fVar35 * fVar35;
          local_58 = uVar20;
          if (fVar30 < 0.0) {
            local_44 = sqrtf(fVar30);
          }
          else {
            local_44 = SQRT(fVar30);
          }
          fVar30 = fVar33 * fVar33 + fVar34 * fVar34;
          if (fVar30 < 0.0) {
            local_64 = sqrtf(fVar30);
          }
          else {
            local_64 = SQRT(fVar30);
          }
          uVar10 = stbtt_GetGlyphShape(info,(uint)(ushort)(uVar8 << 8 | uVar8 >> 8),&comp_verts);
          uVar20 = local_58;
          uVar13 = local_58;
          if ((int)uVar10 < 1) {
LAB_00170110:
            bVar7 = true;
            uVar20 = uVar13 & 0xffffffff;
            bVar23 = bVar23 & 0x20;
          }
          else {
            local_38 = (ulong)uVar10;
            lVar22 = 0;
            do {
              fVar30 = (float)(int)*(short *)((long)&comp_verts->x + lVar22);
              fVar31 = (float)(int)*(short *)((long)&comp_verts->y + lVar22);
              *(short *)((long)&comp_verts->x + lVar22) =
                   (short)(int)((fVar32 * fVar30 + fVar33 * fVar31 + (float)iVar18) * local_44);
              *(short *)((long)&comp_verts->y + lVar22) =
                   (short)(int)((fVar30 * fVar35 + fVar31 * fVar34 + (float)iVar12) * local_64);
              fVar30 = (float)(int)*(short *)((long)&comp_verts->cx + lVar22);
              fVar31 = (float)(int)*(short *)((long)&comp_verts->cy + lVar22);
              *(short *)((long)&comp_verts->cx + lVar22) =
                   (short)(int)((fVar32 * fVar30 + fVar33 * fVar31 + (float)iVar18) * local_44);
              *(short *)((long)&comp_verts->cy + lVar22) =
                   (short)(int)((fVar30 * fVar35 + fVar31 * fVar34 + (float)iVar12) * local_64);
              pIVar9 = GImGui;
              lVar22 = lVar22 + 10;
            } while (local_38 * 10 != lVar22);
            iVar12 = (int)local_58;
            uVar13 = (ulong)(uVar10 + iVar12);
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + 1;
            local_60 = puVar28;
            psVar15 = (stbtt_vertex *)(*(pIVar9->IO).MemAllocFn)(uVar13 * 10);
            pIVar9 = GImGui;
            if (psVar15 != (stbtt_vertex *)0x0) {
              if (0 < iVar12) {
                memcpy(psVar15,vertices,(uVar20 & 0xffffffff) * 10);
              }
              memcpy(psVar15 + (uVar20 & 0xffffffff),comp_verts,local_38 * 10);
              pIVar9 = GImGui;
              if (vertices != (stbtt_vertex *)0x0) {
                piVar1 = &(GImGui->IO).MetricsAllocs;
                *piVar1 = *piVar1 + -1;
                (*(pIVar9->IO).MemFreeFn)(vertices);
              }
              info = local_40;
              if (comp_verts != (stbtt_vertex *)0x0) {
                piVar1 = &(GImGui->IO).MetricsAllocs;
                *piVar1 = *piVar1 + -1;
              }
              (*(GImGui->IO).MemFreeFn)(comp_verts);
              vertices = psVar15;
              puVar28 = local_60;
              goto LAB_00170110;
            }
            if (vertices != (stbtt_vertex *)0x0) {
              piVar1 = &(GImGui->IO).MetricsAllocs;
              *piVar1 = *piVar1 + -1;
              (*(pIVar9->IO).MemFreeFn)(vertices);
            }
            puVar28 = local_60;
            pIVar9 = GImGui;
            if (comp_verts != (stbtt_vertex *)0x0) {
              piVar1 = &(GImGui->IO).MetricsAllocs;
              *piVar1 = *piVar1 + -1;
              (*(pIVar9->IO).MemFreeFn)(comp_verts);
            }
            bVar7 = false;
            bVar23 = bVar25;
          }
          puVar14 = puVar28;
        } while (bVar7);
        iVar12 = (int)uVar20;
        if (bVar25 != 0) goto LAB_00170182;
      }
      else {
        if ((short)((ushort)puVar6[uVar13] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_truetype.h"
                        ,0x5bb,
                        "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
        }
        iVar12 = 0;
        vertices = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar10 = (uint)uVar8 * 2;
      uVar20 = (ulong)uVar10;
      uVar3 = puVar6[uVar20 + uVar13 + 10];
      uVar4 = puVar6[uVar20 + uVar13 + 0xb];
      bVar23 = puVar6[uVar20 + uVar13 + 8];
      bVar25 = puVar6[uVar20 + uVar13 + 9];
      uVar16 = (uint)bVar23 * 0x100 + (uint)bVar25;
      local_58 = (ulong)uVar16;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      vertices = (stbtt_vertex *)
                 (*(pIVar9->IO).MemAllocFn)((ulong)((uVar16 + (uint)uVar8 * 2) * 10 + 10));
      iVar12 = 0;
      if (vertices != (stbtt_vertex *)0x0) {
        local_60 = (ushort *)(puVar6 + uVar13 + 10);
        puVar14 = (ushort *)(puVar6 + (ulong)CONCAT11(uVar3,uVar4) + uVar20 + uVar13 + 0xc);
        uVar16 = (uint)CONCAT11(bVar23,bVar25);
        lVar22 = 0;
        bVar23 = 0;
        bVar25 = 0;
        do {
          if (bVar25 == 0) {
            bVar23 = (byte)*puVar14;
            if ((bVar23 & 8) == 0) {
              puVar14 = (ushort *)((long)puVar14 + 1);
            }
            else {
              bVar25 = *(byte *)((long)puVar14 + 1);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            bVar25 = bVar25 - 1;
          }
          (&vertices[uVar20].type)[lVar22] = bVar23;
          lVar22 = lVar22 + 10;
        } while ((ulong)(uVar16 * 2 + 2) * 5 != lVar22);
        lVar22 = 0;
        sVar24 = 0;
        do {
          bVar23 = (&vertices[uVar20].type)[lVar22];
          if ((bVar23 & 2) == 0) {
            if ((bVar23 & 0x10) == 0) {
              sVar24 = sVar24 + (*puVar14 << 8 | *puVar14 >> 8);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            uVar8 = *puVar14;
            puVar14 = (ushort *)((long)puVar14 + 1);
            uVar26 = -(ushort)(byte)uVar8;
            if ((bVar23 & 0x10) != 0) {
              uVar26 = (ushort)(byte)uVar8;
            }
            sVar24 = sVar24 + uVar26;
          }
          *(short *)((long)&vertices[uVar20].x + lVar22) = sVar24;
          lVar22 = lVar22 + 10;
        } while ((ulong)(uVar16 * 2 + 2) * 5 != lVar22);
        lVar22 = 0;
        sVar24 = 0;
        do {
          bVar23 = (&vertices[uVar20 & 0xffff].type)[lVar22];
          if ((bVar23 & 4) == 0) {
            if ((bVar23 & 0x20) == 0) {
              sVar24 = sVar24 + (*puVar14 << 8 | *puVar14 >> 8);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            uVar8 = *puVar14;
            puVar14 = (ushort *)((long)puVar14 + 1);
            uVar26 = -(ushort)(byte)uVar8;
            if ((bVar23 & 0x20) != 0) {
              uVar26 = (ushort)(byte)uVar8;
            }
            sVar24 = sVar24 + uVar26;
          }
          *(short *)((long)&vertices[uVar20 & 0xffff].y + lVar22) = sVar24;
          lVar22 = lVar22 + 10;
        } while ((ulong)(uVar16 * 2 + 2) * 5 != lVar22);
        num_vertices = 0;
        iVar12 = 0;
        iVar17 = 0;
        iVar11 = 0;
        sVar27 = 0;
        sVar29 = 0;
        sy = 0;
        sx = 0;
        uVar16 = 0;
        was_off = 0;
        iVar18 = 0;
        cy = 0;
        do {
          lVar22 = (long)(int)(uVar10 + iVar12);
          bVar23 = vertices[lVar22].type;
          sVar24 = vertices[lVar22].x;
          sVar5 = vertices[lVar22].y;
          cx = (stbtt_int32)sVar24;
          cy_00 = (stbtt_int32)sVar5;
          if (iVar11 == iVar12) {
            if (iVar12 != 0) {
              num_vertices = stbtt__close_shape(vertices,num_vertices,was_off,uVar16,sx,sy,sVar29,
                                                sVar27,iVar18,cy);
            }
            sx = cx;
            sy = cy_00;
            if ((bVar23 & 1) == 0) {
              sVar29 = cx;
              sVar27 = cy_00;
              if ((vertices[lVar22 + 1].type & 1) == 0) {
                sx = vertices[lVar22 + 1].x + cx >> 1;
                sy = vertices[lVar22 + 1].y + cy_00 >> 1;
              }
              else {
                iVar12 = iVar12 + 1;
                sx = (int)vertices[lVar22 + 1].x;
                sy = (int)vertices[lVar22 + 1].y;
              }
            }
            uVar16 = bVar23 & 1 ^ 1;
            vertices[num_vertices].type = '\x01';
            vertices[num_vertices].x = (short)sx;
            vertices[num_vertices].y = (short)sy;
            vertices[num_vertices].cx = 0;
            vertices[num_vertices].cy = 0;
            iVar11 = (ushort)(*(ushort *)((long)local_60 + (long)iVar17 * 2) << 8 |
                             *(ushort *)((long)local_60 + (long)iVar17 * 2) >> 8) + 1;
            iVar17 = iVar17 + 1;
            was_off = 0;
            iVar21 = iVar12;
            num_vertices = num_vertices + 1;
            cx = iVar18;
            cy_00 = cy;
          }
          else {
            sVar19 = (short)cy;
            iVar21 = iVar12;
            if ((bVar23 & 1) == 0) {
              iVar12 = num_vertices;
              if (was_off != 0) {
                iVar12 = num_vertices + 1;
                vertices[num_vertices].type = '\x03';
                vertices[num_vertices].x = (short)((uint)(iVar18 + cx) >> 1);
                vertices[num_vertices].y = (short)((uint)(cy + cy_00) >> 1);
                vertices[num_vertices].cx = (short)iVar18;
                vertices[num_vertices].cy = sVar19;
              }
              was_off = 1;
              num_vertices = iVar12;
            }
            else {
              psVar15 = vertices + num_vertices;
              if (was_off == 0) {
                psVar15->type = '\x02';
                psVar15->x = sVar24;
                psVar15->y = sVar5;
                psVar15->cx = 0;
                sVar19 = 0;
              }
              else {
                psVar15->type = '\x03';
                psVar15->x = sVar24;
                psVar15->y = sVar5;
                psVar15->cx = (short)iVar18;
              }
              psVar15->cy = sVar19;
              was_off = 0;
              num_vertices = num_vertices + 1;
              cx = iVar18;
              cy_00 = cy;
            }
          }
          iVar12 = iVar21 + 1;
          iVar18 = cx;
          cy = cy_00;
        } while (iVar21 < (int)local_58);
        iVar12 = stbtt__close_shape(vertices,num_vertices,was_off,uVar16,sx,sy,sVar29,sVar27,cx,
                                    cy_00);
      }
      if (vertices == (stbtt_vertex *)0x0) {
        return 0;
      }
    }
    *local_50 = vertices;
  }
  return iVar12;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   stbtt_int16 numberOfContours;
   stbtt_uint8 *endPtsOfContours;
   stbtt_uint8 *data = info->data;
   stbtt_vertex *vertices=0;
   int num_vertices=0;
   int g = stbtt__GetGlyfOffset(info, glyph_index);

   *pvertices = NULL;

   if (g < 0) return 0;

   numberOfContours = ttSHORT(data + g);

   if (numberOfContours > 0) {
      stbtt_uint8 flags=0,flagcount;
      stbtt_int32 ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
      stbtt_int32 x,y,cx,cy,sx,sy, scx,scy;
      stbtt_uint8 *points;
      endPtsOfContours = (data + g + 10);
      ins = ttUSHORT(data + g + 10 + numberOfContours * 2);
      points = data + g + 10 + numberOfContours * 2 + 2 + ins;

      n = 1+ttUSHORT(endPtsOfContours + numberOfContours*2-2);

      m = n + 2*numberOfContours;  // a loose bound on how many vertices we might need
      vertices = (stbtt_vertex *) STBTT_malloc(m * sizeof(vertices[0]), info->userdata);
      if (vertices == 0)
         return 0;

      next_move = 0;
      flagcount=0;

      // in first pass, we load uninterpreted data into the allocated array
      // above, shifted to the end of the array so we won't overwrite it when
      // we create our final data starting from the front

      off = m - n; // starting offset for uninterpreted data, regardless of how m ends up being calculated

      // first load flags

      for (i=0; i < n; ++i) {
         if (flagcount == 0) {
            flags = *points++;
            if (flags & 8)
               flagcount = *points++;
         } else
            --flagcount;
         vertices[off+i].type = flags;
      }

      // now load x coordinates
      x=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 2) {
            stbtt_int16 dx = *points++;
            x += (flags & 16) ? dx : -dx; // ???
         } else {
            if (!(flags & 16)) {
               x = x + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].x = (stbtt_int16) x;
      }

      // now load y coordinates
      y=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 4) {
            stbtt_int16 dy = *points++;
            y += (flags & 32) ? dy : -dy; // ???
         } else {
            if (!(flags & 32)) {
               y = y + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].y = (stbtt_int16) y;
      }

      // now convert them to our format
      num_vertices=0;
      sx = sy = cx = cy = scx = scy = 0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         x     = (stbtt_int16) vertices[off+i].x;
         y     = (stbtt_int16) vertices[off+i].y;

         if (next_move == i) {
            if (i != 0)
               num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

            // now start the new one               
            start_off = !(flags & 1);
            if (start_off) {
               // if we start off with an off-curve point, then when we need to find a point on the curve
               // where we can start, and we need to save some state for when we wraparound.
               scx = x;
               scy = y;
               if (!(vertices[off+i+1].type & 1)) {
                  // next point is also a curve point, so interpolate an on-point curve
                  sx = (x + (stbtt_int32) vertices[off+i+1].x) >> 1;
                  sy = (y + (stbtt_int32) vertices[off+i+1].y) >> 1;
               } else {
                  // otherwise just use the next point as our start point
                  sx = (stbtt_int32) vertices[off+i+1].x;
                  sy = (stbtt_int32) vertices[off+i+1].y;
                  ++i; // we're using point i+1 as the starting point, so skip it
               }
            } else {
               sx = x;
               sy = y;
            }
            stbtt_setvertex(&vertices[num_vertices++], STBTT_vmove,sx,sy,0,0);
            was_off = 0;
            next_move = 1 + ttUSHORT(endPtsOfContours+j*2);
            ++j;
         } else {
            if (!(flags & 1)) { // if it's a curve
               if (was_off) // two off-curve control points in a row means interpolate an on-curve midpoint
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
               cx = x;
               cy = y;
               was_off = 1;
            } else {
               if (was_off)
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, x,y, cx, cy);
               else
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vline, x,y,0,0);
               was_off = 0;
            }
         }
      }
      num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
   } else if (numberOfContours == -1) {
      // Compound shapes.
      int more = 1;
      stbtt_uint8 *comp = data + g + 10;
      num_vertices = 0;
      vertices = 0;
      while (more) {
         stbtt_uint16 flags, gidx;
         int comp_num_verts = 0, i;
         stbtt_vertex *comp_verts = 0, *tmp = 0;
         float mtx[6] = {1,0,0,1,0,0}, m, n;
         
         flags = ttSHORT(comp); comp+=2;
         gidx = ttSHORT(comp); comp+=2;

         if (flags & 2) { // XY values
            if (flags & 1) { // shorts
               mtx[4] = ttSHORT(comp); comp+=2;
               mtx[5] = ttSHORT(comp); comp+=2;
            } else {
               mtx[4] = ttCHAR(comp); comp+=1;
               mtx[5] = ttCHAR(comp); comp+=1;
            }
         }
         else {
            // @TODO handle matching point
            STBTT_assert(0);
         }
         if (flags & (1<<3)) { // WE_HAVE_A_SCALE
            mtx[0] = mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
         } else if (flags & (1<<6)) { // WE_HAVE_AN_X_AND_YSCALE
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         } else if (flags & (1<<7)) { // WE_HAVE_A_TWO_BY_TWO
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[2] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         }
         
         // Find transformation scales.
         m = (float) STBTT_sqrt(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
         n = (float) STBTT_sqrt(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

         // Get indexed glyph.
         comp_num_verts = stbtt_GetGlyphShape(info, gidx, &comp_verts);
         if (comp_num_verts > 0) {
            // Transform vertices.
            for (i = 0; i < comp_num_verts; ++i) {
               stbtt_vertex* v = &comp_verts[i];
               stbtt_vertex_type x,y;
               x=v->x; y=v->y;
               v->x = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->y = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
               x=v->cx; y=v->cy;
               v->cx = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->cy = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
            }
            // Append vertices.
            tmp = (stbtt_vertex*)STBTT_malloc((num_vertices+comp_num_verts)*sizeof(stbtt_vertex), info->userdata);
            if (!tmp) {
               if (vertices) STBTT_free(vertices, info->userdata);
               if (comp_verts) STBTT_free(comp_verts, info->userdata);
               return 0;
            }
            if (num_vertices > 0) STBTT_memcpy(tmp, vertices, num_vertices*sizeof(stbtt_vertex));
            STBTT_memcpy(tmp+num_vertices, comp_verts, comp_num_verts*sizeof(stbtt_vertex));
            if (vertices) STBTT_free(vertices, info->userdata);
            vertices = tmp;
            STBTT_free(comp_verts, info->userdata);
            num_vertices += comp_num_verts;
         }
         // More components ?
         more = flags & (1<<5);
      }
   } else if (numberOfContours < 0) {
      // @TODO other compound variations?
      STBTT_assert(0);
   } else {
      // numberOfCounters == 0, do nothing
   }

   *pvertices = vertices;
   return num_vertices;
}